

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O2

void __thiscall cmMakefileTargetGenerator::WriteTargetDependRules(cmMakefileTargetGenerator *this)

{
  cmLocalUnixMakefileGenerator3 *this_00;
  string *this_01;
  cmGeneratedFileStream *pcVar1;
  ostream *poVar2;
  _Base_ptr p_Var3;
  char *pcVar4;
  _Alloc_hider _Var5;
  allocator local_374;
  allocator local_373;
  allocator local_372;
  allocator local_371;
  string *local_370;
  string local_368;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commands;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  string local_308;
  string depTarget;
  string local_2c8;
  string local_2a8;
  string local_288;
  string local_268;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  string dir;
  ostringstream depCmd;
  string *local_1a0;
  
  (*(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
    _vptr_cmLocalGenerator[0xb])
            (&dir,this->LocalGenerator,(this->super_cmCommonTargetGenerator).GeneratorTarget);
  local_370 = &this->InfoFileNameFull;
  std::__cxx11::string::_M_assign((string *)local_370);
  std::__cxx11::string::append((char *)local_370);
  this_01 = local_370;
  cmLocalUnixMakefileGenerator3::ConvertToFullPath((string *)&depCmd,this->LocalGenerator,local_370)
  ;
  std::__cxx11::string::operator=((string *)this_01,(string *)&depCmd);
  std::__cxx11::string::~string((string *)&depCmd);
  pcVar1 = (cmGeneratedFileStream *)operator_new(0x248);
  cmGeneratedFileStream::cmGeneratedFileStream(pcVar1,(local_370->_M_dataplus)._M_p,false);
  this->InfoFileStream = pcVar1;
  cmGeneratedFileStream::SetCopyIfDifferent(pcVar1,true);
  pcVar1 = this->InfoFileStream;
  if (((&(pcVar1->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
       [(long)(pcVar1->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.
              _vptr_basic_ostream[-3]] & 5) == 0) {
    cmLocalUnixMakefileGenerator3::WriteDependLanguageInfo
              (this->LocalGenerator,(ostream *)pcVar1,
               (this->super_cmCommonTargetGenerator).GeneratorTarget);
    if ((this->MultipleOutputPairs)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      poVar2 = std::operator<<((ostream *)this->InfoFileStream,"\n");
      poVar2 = std::operator<<(poVar2,"# Pairs of files generated by the same build rule.\n");
      std::operator<<(poVar2,"set(CMAKE_MULTIPLE_OUTPUT_PAIRS\n");
      for (p_Var3 = (this->MultipleOutputPairs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left
          ; (_Rb_tree_header *)p_Var3 !=
            &(this->MultipleOutputPairs)._M_t._M_impl.super__Rb_tree_header;
          p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
        poVar2 = std::operator<<((ostream *)this->InfoFileStream,"  ");
        cmOutputConverter::EscapeForCMake((string *)&depCmd,(string *)(p_Var3 + 1));
        poVar2 = std::operator<<(poVar2,(string *)&depCmd);
        poVar2 = std::operator<<(poVar2," ");
        cmOutputConverter::EscapeForCMake(&depTarget,(string *)(p_Var3 + 2));
        poVar2 = std::operator<<(poVar2,(string *)&depTarget);
        std::operator<<(poVar2,"\n");
        std::__cxx11::string::~string((string *)&depTarget);
        std::__cxx11::string::~string((string *)&depCmd);
      }
      std::operator<<((ostream *)this->InfoFileStream,"  )\n\n");
    }
    poVar2 = std::operator<<((ostream *)this->InfoFileStream,"\n");
    poVar2 = std::operator<<(poVar2,"# Targets to which this target links.\n");
    std::operator<<(poVar2,"set(CMAKE_TARGET_LINKED_INFO_FILES\n");
    cmCommonTargetGenerator::GetLinkedTargetDirectories_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&depCmd,&this->super_cmCommonTargetGenerator);
    for (_Var5._M_p = _depCmd; (string *)_Var5._M_p != local_1a0; _Var5._M_p = _Var5._M_p + 0x20) {
      poVar2 = std::operator<<((ostream *)this->InfoFileStream,"  \"");
      poVar2 = std::operator<<(poVar2,(string *)_Var5._M_p);
      std::operator<<(poVar2,"/DependInfo.cmake\"\n");
    }
    std::operator<<((ostream *)this->InfoFileStream,"  )\n");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&depCmd);
    poVar2 = std::operator<<((ostream *)this->InfoFileStream,"\n");
    poVar2 = std::operator<<(poVar2,"# Fortran module output directory.\n");
    poVar2 = std::operator<<(poVar2,"set(CMAKE_Fortran_TARGET_MODULE_DIR \"");
    cmCommonTargetGenerator::GetFortranModuleDirectory_abi_cxx11_
              ((string *)&depCmd,&this->super_cmCommonTargetGenerator);
    poVar2 = std::operator<<(poVar2,(string *)&depCmd);
    std::operator<<(poVar2,"\")\n");
    std::__cxx11::string::~string((string *)&depCmd);
    depends.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    commands.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    depends.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    depends.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    commands.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    commands.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    cmLocalUnixMakefileGenerator3::GetRelativeTargetDirectory_abi_cxx11_
              (&depTarget,this->LocalGenerator,(this->super_cmCommonTargetGenerator).GeneratorTarget
              );
    std::__cxx11::string::append((char *)&depTarget);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&depCmd);
    poVar2 = std::operator<<((ostream *)&depCmd,"cd ");
    this_00 = this->LocalGenerator;
    pcVar4 = cmLocalGenerator::GetBinaryDirectory((cmLocalGenerator *)this_00);
    std::__cxx11::string::string((string *)&local_308,pcVar4,(allocator *)&local_2c8);
    cmOutputConverter::Convert
              (&local_368,
               &(this_00->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,&local_308,FULL,SHELL);
    poVar2 = std::operator<<(poVar2,(string *)&local_368);
    std::operator<<(poVar2," && ");
    std::__cxx11::string::~string((string *)&local_368);
    std::__cxx11::string::~string((string *)&local_308);
    poVar2 = std::operator<<((ostream *)&depCmd,"$(CMAKE_COMMAND) -E cmake_depends \"");
    (*(this->GlobalGenerator->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
      _vptr_cmGlobalGenerator[3])(&local_368);
    poVar2 = std::operator<<(poVar2,(string *)&local_368);
    poVar2 = std::operator<<(poVar2,"\" ");
    pcVar4 = cmLocalGenerator::GetSourceDirectory((cmLocalGenerator *)this->LocalGenerator);
    std::__cxx11::string::string((string *)&local_2c8,pcVar4,&local_371);
    cmCommonTargetGenerator::Convert
              (&local_308,&this->super_cmCommonTargetGenerator,&local_2c8,FULL,SHELL);
    poVar2 = std::operator<<(poVar2,(string *)&local_308);
    poVar2 = std::operator<<(poVar2," ");
    pcVar4 = cmLocalGenerator::GetCurrentSourceDirectory((cmLocalGenerator *)this->LocalGenerator);
    std::__cxx11::string::string((string *)&local_208,pcVar4,&local_372);
    cmCommonTargetGenerator::Convert
              (&local_1e8,&this->super_cmCommonTargetGenerator,&local_208,FULL,SHELL);
    poVar2 = std::operator<<(poVar2,(string *)&local_1e8);
    poVar2 = std::operator<<(poVar2," ");
    pcVar4 = cmLocalGenerator::GetBinaryDirectory((cmLocalGenerator *)this->LocalGenerator);
    std::__cxx11::string::string((string *)&local_248,pcVar4,&local_373);
    cmCommonTargetGenerator::Convert
              (&local_228,&this->super_cmCommonTargetGenerator,&local_248,FULL,SHELL);
    poVar2 = std::operator<<(poVar2,(string *)&local_228);
    poVar2 = std::operator<<(poVar2," ");
    pcVar4 = cmLocalGenerator::GetCurrentBinaryDirectory((cmLocalGenerator *)this->LocalGenerator);
    std::__cxx11::string::string((string *)&local_288,pcVar4,&local_374);
    cmCommonTargetGenerator::Convert
              (&local_268,&this->super_cmCommonTargetGenerator,&local_288,FULL,SHELL);
    poVar2 = std::operator<<(poVar2,(string *)&local_268);
    poVar2 = std::operator<<(poVar2," ");
    cmCommonTargetGenerator::Convert
              (&local_2a8,&this->super_cmCommonTargetGenerator,local_370,FULL,SHELL);
    std::operator<<(poVar2,(string *)&local_2a8);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::string::~string((string *)&local_288);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&local_308);
    std::__cxx11::string::~string((string *)&local_2c8);
    std::__cxx11::string::~string((string *)&local_368);
    if (this->LocalGenerator->ColorMakefile == true) {
      std::operator<<((ostream *)&depCmd," --color=$(COLOR)");
    }
    std::__cxx11::stringbuf::str();
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&commands,
               &local_368);
    std::__cxx11::string::~string((string *)&local_368);
    if (this->CustomCommandDriver == OnDepends) {
      DriveCustomCommands(this,&depends);
    }
    cmLocalUnixMakefileGenerator3::WriteMakeRule
              (this->LocalGenerator,(ostream *)this->BuildFileStream,(char *)0x0,&depTarget,&depends
               ,&commands,true,false);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&depCmd);
    std::__cxx11::string::~string((string *)&depTarget);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&commands);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&depends);
  }
  std::__cxx11::string::~string((string *)&dir);
  return;
}

Assistant:

void cmMakefileTargetGenerator::WriteTargetDependRules()
{
  // must write the targets depend info file
  std::string dir =
      this->LocalGenerator->GetTargetDirectory(this->GeneratorTarget);
  this->InfoFileNameFull = dir;
  this->InfoFileNameFull += "/DependInfo.cmake";
  this->InfoFileNameFull =
    this->LocalGenerator->ConvertToFullPath(this->InfoFileNameFull);
  this->InfoFileStream =
    new cmGeneratedFileStream(this->InfoFileNameFull.c_str());
  this->InfoFileStream->SetCopyIfDifferent(true);
  if(!*this->InfoFileStream)
    {
    return;
    }
  this->LocalGenerator->
    WriteDependLanguageInfo(*this->InfoFileStream, this->GeneratorTarget);

  // Store multiple output pairs in the depend info file.
  if(!this->MultipleOutputPairs.empty())
    {
    *this->InfoFileStream
      << "\n"
      << "# Pairs of files generated by the same build rule.\n"
      << "set(CMAKE_MULTIPLE_OUTPUT_PAIRS\n";
    for(MultipleOutputPairsType::const_iterator pi =
          this->MultipleOutputPairs.begin();
        pi != this->MultipleOutputPairs.end(); ++pi)
      {
      *this->InfoFileStream
        << "  " << cmOutputConverter::EscapeForCMake(pi->first)
        << " "  << cmOutputConverter::EscapeForCMake(pi->second)
        << "\n";
      }
    *this->InfoFileStream << "  )\n\n";
    }

  // Store list of targets linked directly or transitively.
  {
  *this->InfoFileStream
    << "\n"
    << "# Targets to which this target links.\n"
    << "set(CMAKE_TARGET_LINKED_INFO_FILES\n";
  std::vector<std::string> dirs = this->GetLinkedTargetDirectories();
  for (std::vector<std::string>::iterator i = dirs.begin();
       i != dirs.end(); ++i)
    {
    *this->InfoFileStream << "  \"" << *i << "/DependInfo.cmake\"\n";
    }
  *this->InfoFileStream
    << "  )\n";
  }

  *this->InfoFileStream
    << "\n"
    << "# Fortran module output directory.\n"
    << "set(CMAKE_Fortran_TARGET_MODULE_DIR \""
    << this->GetFortranModuleDirectory() << "\")\n";

  // and now write the rule to use it
  std::vector<std::string> depends;
  std::vector<std::string> commands;

  // Construct the name of the dependency generation target.
  std::string depTarget =
    this->LocalGenerator->GetRelativeTargetDirectory(this->GeneratorTarget);
  depTarget += "/depend";

  // Add a command to call CMake to scan dependencies.  CMake will
  // touch the corresponding depends file after scanning dependencies.
  std::ostringstream depCmd;
  // TODO: Account for source file properties and directory-level
  // definitions when scanning for dependencies.
#if !defined(_WIN32) || defined(__CYGWIN__)
  // This platform supports symlinks, so cmSystemTools will translate
  // paths.  Make sure PWD is set to the original name of the home
  // output directory to help cmSystemTools to create the same
  // translation table for the dependency scanning process.
  depCmd << "cd "
         << (this->LocalGenerator->Convert(
               this->LocalGenerator->GetBinaryDirectory(),
               cmLocalGenerator::FULL, cmLocalGenerator::SHELL))
         << " && ";
#endif
  // Generate a call this signature:
  //
  //   cmake -E cmake_depends <generator>
  //                          <home-src-dir> <start-src-dir>
  //                          <home-out-dir> <start-out-dir>
  //                          <dep-info> --color=$(COLOR)
  //
  // This gives the dependency scanner enough information to recreate
  // the state of our local generator sufficiently for its needs.
  depCmd << "$(CMAKE_COMMAND) -E cmake_depends \""
         << this->GlobalGenerator->GetName() << "\" "
         << this->Convert(this->LocalGenerator->GetSourceDirectory(),
                          cmLocalGenerator::FULL, cmLocalGenerator::SHELL)
         << " "
         << this->Convert(this->LocalGenerator->GetCurrentSourceDirectory(),
                          cmLocalGenerator::FULL, cmLocalGenerator::SHELL)
         << " "
         << this->Convert(this->LocalGenerator->GetBinaryDirectory(),
                          cmLocalGenerator::FULL, cmLocalGenerator::SHELL)
         << " "
         << this->Convert(this->LocalGenerator->GetCurrentBinaryDirectory(),
                          cmLocalGenerator::FULL, cmLocalGenerator::SHELL)
         << " "
         << this->Convert(this->InfoFileNameFull,
                          cmLocalGenerator::FULL, cmLocalGenerator::SHELL);
  if(this->LocalGenerator->GetColorMakefile())
    {
    depCmd << " --color=$(COLOR)";
    }
  commands.push_back(depCmd.str());

  // Make sure all custom command outputs in this target are built.
  if(this->CustomCommandDriver == OnDepends)
    {
    this->DriveCustomCommands(depends);
    }

  // Write the rule.
  this->LocalGenerator->WriteMakeRule(*this->BuildFileStream, 0,
                                      depTarget,
                                      depends, commands, true);
}